

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdNormalizeDecimal(EpDouble *epd)

{
  int iVar1;
  double dVar2;
  int exponent;
  EpDouble *epd_local;
  
  iVar1 = IsNanOrInfDouble((epd->type).value);
  if (iVar1 == 0) {
    iVar1 = EpdGetExponentDecimal((epd->type).value);
    dVar2 = pow(10.0,(double)iVar1);
    (epd->type).value = (epd->type).value / dVar2;
    epd->exponent = iVar1 + epd->exponent;
  }
  else {
    epd->exponent = 0;
  }
  return;
}

Assistant:

void
EpdNormalizeDecimal(EpDouble *epd)
{
  int           exponent;

  if (IsNanOrInfDouble(epd->type.value)) {
    epd->exponent = 0;
    return;
  }

  exponent = EpdGetExponentDecimal(epd->type.value);
  epd->type.value /= pow((double)10.0, (double)exponent);
  epd->exponent += exponent;
}